

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O0

bool test_std_supports_SJIS_codecvt(string *locale_name)

{
  char *pcVar1;
  exception *anon_var_0;
  wstring ref;
  wstring cmp;
  wfstream test;
  ofstream f;
  char *japan_932;
  bool res;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__rhs;
  ostream *__lhs;
  wstring local_490 [39];
  allocator local_469;
  wstring local_468 [32];
  locale local_448 [8];
  locale local_440 [8];
  long local_438 [68];
  ostream local_218 [512];
  char *local_18;
  byte local_9;
  
  local_9 = 1;
  local_18 = anon_var_dwarf_5b73;
  __lhs = local_218;
  std::ofstream::ofstream(__lhs,"test-siftjis.txt",_S_out);
  std::operator<<(__lhs,local_18);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  std::wfstream::wfstream(local_438);
  __rhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
          ((long)local_438 + *(long *)(local_438[0] + -0x18));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::locale::locale(local_448,pcVar1);
  std::wios::imbue(local_440);
  std::locale::~locale(local_440);
  std::locale::~locale(local_448);
  std::operator|(_S_in,_S_out);
  std::wfstream::open((char *)local_438,0x124361);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_468,L"日本",&local_469);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_469);
  std::__cxx11::wstring::wstring(local_490);
  std::operator>>((wistream *)local_438,local_490);
  local_9 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)__lhs,__rhs);
  std::__cxx11::wstring::~wstring(local_490);
  std::__cxx11::wstring::~wstring(local_468);
  std::wfstream::~wfstream(local_438);
  remove("test-siftjis.txt");
  return (bool)(local_9 & 1);
}

Assistant:

inline bool test_std_supports_SJIS_codecvt(std::string const &locale_name)
{
    bool res = true;
    {
    // Japan in Shift JIS/cp932
        char const *japan_932 = "\x93\xfa\x96\x7b";
        std::ofstream f("test-siftjis.txt");
        f<<japan_932;
        f.close();		
    }
    try {
        std::wfstream test;
        test.imbue(std::locale(locale_name.c_str()));
        test.open("test-siftjis.txt");
        // Japan in Unicode
        std::wstring cmp = L"\u65e5\u672c";
        std::wstring ref;
        test >> ref;
        res = ref == cmp;
    }
    catch(std::exception const &)
    {
        res = false;
    }
    remove("test-siftjis.txt");
    return res;
}